

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch_descriptorset_pass.cpp
# Opt level: O3

Status __thiscall spvtools::opt::SwitchDescriptorSetPass::Process(SwitchDescriptorSetPass *this)

{
  IRContext *this_00;
  Module *pMVar1;
  DecorationManager *this_01;
  Instruction *pIVar2;
  pointer pOVar3;
  pointer ppIVar4;
  uint32_t uVar5;
  IRContext *pIVar6;
  ulong uVar7;
  ulong uVar8;
  pointer ppIVar9;
  uint uVar10;
  Instruction *pIVar11;
  Instruction *this_02;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> decos;
  Status local_7c;
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48;
  
  this_00 = (this->super_Pass).context_;
  pIVar6 = this_00;
  if ((this_00->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    IRContext::BuildDecorationManager(this_00);
    pIVar6 = (this->super_Pass).context_;
  }
  pMVar1 = (pIVar6->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  this_02 = *(Instruction **)
             ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
  ;
  pIVar11 = (Instruction *)
            ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  if (this_02 == pIVar11) {
    local_7c = SuccessWithoutChange;
  }
  else {
    this_01 = (this_00->decoration_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
              _M_head_impl;
    local_7c = SuccessWithoutChange;
    do {
      if (this_02->opcode_ == OpVariable) {
        uVar5 = 0;
        if (this_02->has_result_id_ == true) {
          uVar5 = Instruction::GetSingleWordOperand(this_02,(uint)this_02->has_type_id_);
        }
        analysis::DecorationManager::GetDecorationsFor(&local_48,this_01,uVar5,false);
        ppIVar4 = local_48.
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppIVar9 = local_48.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppIVar9 != ppIVar4;
            ppIVar9 = ppIVar9 + 1) {
          pIVar2 = *ppIVar9;
          uVar10 = (pIVar2->has_result_id_ & 1) + 1;
          if (pIVar2->has_type_id_ == false) {
            uVar10 = (uint)pIVar2->has_result_id_;
          }
          uVar5 = Instruction::GetSingleWordOperand(pIVar2,uVar10 + 1);
          if (uVar5 == 0x22) {
            pIVar2 = *ppIVar9;
            uVar10 = (pIVar2->has_result_id_ & 1) + 1;
            if (pIVar2->has_type_id_ == false) {
              uVar10 = (uint)pIVar2->has_result_id_;
            }
            uVar5 = Instruction::GetSingleWordOperand(pIVar2,uVar10 + 2);
            if (uVar5 == *(uint32_t *)&(this->super_Pass).field_0x34) {
              pIVar2 = *ppIVar9;
              local_70._16_4_ = this->ds_to_;
              local_70._0_8_ = &PTR__SmallVector_00b02ef8;
              local_70._24_8_ = local_70 + 0x10;
              local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
              local_70._8_8_ = 1;
              uVar7 = (ulong)(pIVar2->has_result_id_ & 1) + 1;
              if (pIVar2->has_type_id_ == false) {
                uVar7 = (ulong)pIVar2->has_result_id_;
              }
              uVar7 = uVar7 + 2;
              pOVar3 = (pIVar2->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar8 = ((long)(pIVar2->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 4) *
                      -0x5555555555555555;
              if (uVar8 < uVar7 || uVar8 - uVar7 == 0) {
                __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                              ,0x2b8,
                              "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                             );
              }
              utils::SmallVector<unsigned_int,_2UL>::operator=
                        ((SmallVector<unsigned_int,_2UL> *)
                         ((long)((pOVar3->words).buffer + 0xfffffffffffffffc) +
                         (ulong)(uint)((int)uVar7 * 0x30)),
                         (SmallVector<unsigned_int,_2UL> *)local_70);
              local_70._0_8_ = &PTR__SmallVector_00b02ef8;
              if (local_50._M_head_impl !=
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&local_50,local_50._M_head_impl);
              }
              local_7c = SuccessWithChange;
              break;
            }
          }
        }
        if (local_48.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      this_02 = (this_02->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (this_02 != pIVar11);
  }
  return local_7c;
}

Assistant:

Pass::Status SwitchDescriptorSetPass::Process() {
  Status status = Status::SuccessWithoutChange;
  auto* deco_mgr = context()->get_decoration_mgr();

  for (Instruction& var : context()->types_values()) {
    if (var.opcode() != spv::Op::OpVariable) {
      continue;
    }
    auto decos = deco_mgr->GetDecorationsFor(var.result_id(), false);
    for (const auto& deco : decos) {
      spv::Decoration d = spv::Decoration(deco->GetSingleWordInOperand(1u));
      if (d == spv::Decoration::DescriptorSet &&
          deco->GetSingleWordInOperand(2u) == ds_from_) {
        deco->SetInOperand(2u, {ds_to_});
        status = Status::SuccessWithChange;
        break;
      }
    }
  }
  return status;
}